

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.h
# Opt level: O2

void __thiscall FBX::Material::Material(Material *this,Node *node)

{
  double dVar1;
  __type _Var2;
  variant_alternative_t<5UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar3;
  variant_alternative_t<6UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar4;
  pointer pNVar5;
  Vector3 VVar6;
  Node properties;
  allocator<char> local_10b;
  allocator<char> local_10a;
  allocator<char> local_109;
  Node local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [32];
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_68;
  string local_50 [32];
  
  pvVar3 = std::
           get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     ((node->properties).
                      super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  (this->super_Object).id = *pvVar3;
  (this->texture).super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->texture).super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"ShadingModel",&local_10a);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"phong",&local_10b);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"Properties70",&local_109);
  findNodes(&local_68,node,(string *)local_88);
  Node::Node(&local_108,
             local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_68);
  std::__cxx11::string::~string((string *)local_88);
  pNVar5 = local_108.children.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pNVar5 == local_108.children.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&this->shadingModel,local_50);
LAB_00109d2c:
      Node::~Node(&local_108);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"EmissiveFactor",(allocator<char> *)&local_a8);
      local_88._0_8_ = (pointer)0x0;
      dVar1 = getProperty<double>(node,(string *)&local_108,(double *)local_88);
      std::__cxx11::string::~string((string *)&local_108);
      this->emissiveFactor = dVar1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"AmbientColor",(allocator<char> *)&local_a8);
      local_88._8_4_ = 0.0;
      local_88._0_8_ = (pointer)0x0;
      VVar6 = getProperty(node,(string *)&local_108,(Vector3 *)local_88);
      (this->ambientColor).x = (float)(int)VVar6._0_8_;
      (this->ambientColor).y = (float)(int)((ulong)VVar6._0_8_ >> 0x20);
      (this->ambientColor).z = VVar6.z;
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"DiffuseColor",(allocator<char> *)&local_a8);
      local_88._8_4_ = 0.0;
      local_88._0_8_ = (pointer)0x0;
      VVar6 = getProperty(node,(string *)&local_108,(Vector3 *)local_88);
      (this->diffuseColor).x = (float)(int)VVar6._0_8_;
      (this->diffuseColor).y = (float)(int)((ulong)VVar6._0_8_ >> 0x20);
      (this->diffuseColor).z = VVar6.z;
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"TransparentColor",(allocator<char> *)&local_a8);
      local_88._8_4_ = 0.0;
      local_88._0_8_ = (pointer)0x0;
      VVar6 = getProperty(node,(string *)&local_108,(Vector3 *)local_88);
      (this->transparentColor).x = (float)(int)VVar6._0_8_;
      (this->transparentColor).y = (float)(int)((ulong)VVar6._0_8_ >> 0x20);
      (this->transparentColor).z = VVar6.z;
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"SpecularColor",(allocator<char> *)&local_a8);
      local_88._8_4_ = 0.0;
      local_88._0_8_ = (pointer)0x0;
      VVar6 = getProperty(node,(string *)&local_108,(Vector3 *)local_88);
      (this->specularColor).x = (float)(int)VVar6._0_8_;
      (this->specularColor).y = (float)(int)((ulong)VVar6._0_8_ >> 0x20);
      (this->specularColor).z = VVar6.z;
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"ShininessExponent",(allocator<char> *)&local_a8);
      local_88._0_8_ = (pointer)0x4000000000000000;
      dVar1 = getProperty<double>(node,(string *)&local_108,(double *)local_88);
      std::__cxx11::string::~string((string *)&local_108);
      this->shininessExponent = dVar1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Emissive",(allocator<char> *)&local_a8);
      local_88._8_4_ = 0.0;
      local_88._0_8_ = (pointer)0x0;
      VVar6 = getProperty(node,(string *)&local_108,(Vector3 *)local_88);
      (this->emissive).x = (float)(int)VVar6._0_8_;
      (this->emissive).y = (float)(int)((ulong)VVar6._0_8_ >> 0x20);
      (this->emissive).z = VVar6.z;
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Ambient",(allocator<char> *)&local_a8);
      local_88._8_4_ = 0.0;
      local_88._0_8_ = (pointer)0x0;
      VVar6 = getProperty(node,(string *)&local_108,(Vector3 *)local_88);
      (this->ambient).x = (float)(int)VVar6._0_8_;
      (this->ambient).y = (float)(int)((ulong)VVar6._0_8_ >> 0x20);
      (this->ambient).z = VVar6.z;
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Diffuse",(allocator<char> *)&local_a8);
      local_88._8_4_ = 0.0;
      local_88._0_8_ = (pointer)0x0;
      VVar6 = getProperty(node,(string *)&local_108,(Vector3 *)local_88);
      (this->diffuse).x = (float)(int)VVar6._0_8_;
      (this->diffuse).y = (float)(int)((ulong)VVar6._0_8_ >> 0x20);
      (this->diffuse).z = VVar6.z;
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Specular",(allocator<char> *)&local_a8);
      local_88._8_4_ = 0.0;
      local_88._0_8_ = (pointer)0x0;
      VVar6 = getProperty(node,(string *)&local_108,(Vector3 *)local_88);
      (this->specular).x = (float)(int)VVar6._0_8_;
      (this->specular).y = (float)(int)((ulong)VVar6._0_8_ >> 0x20);
      (this->specular).z = VVar6.z;
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Shininess",(allocator<char> *)&local_a8);
      local_88._0_8_ = (pointer)0x4000000000000000;
      dVar1 = getProperty<double>(node,(string *)&local_108,(double *)local_88);
      std::__cxx11::string::~string((string *)&local_108);
      this->shininess = dVar1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Opacity",(allocator<char> *)&local_a8);
      local_88._0_8_ = (pointer)0x3ff0000000000000;
      dVar1 = getProperty<double>(node,(string *)&local_108,(double *)local_88);
      std::__cxx11::string::~string((string *)&local_108);
      this->opacity = dVar1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Reflectivity",(allocator<char> *)&local_a8);
      local_88._0_8_ = (pointer)0x0;
      dVar1 = getProperty<double>(node,(string *)&local_108,(double *)local_88);
      std::__cxx11::string::~string((string *)&local_108);
      this->reflectivity = dVar1;
      return;
    }
    pvVar4 = std::
             get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       ((pNVar5->properties).
                        super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    _Var2 = std::operator==(pvVar4,&local_a8);
    if (_Var2) {
      pvVar4 = std::
               get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         ((pNVar5->properties).
                          super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
      std::__cxx11::string::string((string *)&this->shadingModel,(string *)pvVar4);
      goto LAB_00109d2c;
    }
    pNVar5 = pNVar5 + 1;
  } while( true );
}

Assistant:

explicit Material(const Node &node) :
                Object(std::get<int64_t>(node.properties[0])),
                shadingModel(getProperty<std::string>(node, "ShadingModel", "phong")),
                emissiveFactor(getProperty(node, "EmissiveFactor", 0.0)),
                ambientColor(getProperty(node, "AmbientColor", {})),
                diffuseColor(getProperty(node, "DiffuseColor", {})),
                transparentColor(getProperty(node, "TransparentColor", {})),
                specularColor(getProperty(node, "SpecularColor", {})),
                shininessExponent(getProperty(node, "ShininessExponent", 2.0)),
                emissive(getProperty(node, "Emissive", {})),
                ambient(getProperty(node, "Ambient", {})),
                diffuse(getProperty(node, "Diffuse", {})),
                specular(getProperty(node, "Specular", {})),
                shininess(getProperty(node, "Shininess", 2.0)),
                opacity(getProperty(node, "Opacity", 1.0)),
                reflectivity(getProperty(node, "Reflectivity", 0.0)) {}